

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  pointer pfVar3;
  undefined4 uVar4;
  pointer pfVar5;
  pointer pfVar6;
  undefined4 uVar13;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  pointer p_Var11;
  pointer p_Var12;
  bool bVar14;
  int iVar15;
  pointer pfVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pvVar19;
  ulong uVar20;
  long lVar21;
  PrimGroup *pPVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> *__x;
  bool bVar27;
  ulong uVar28;
  pointer pvVar29;
  undefined7 in_register_00000089;
  anon_struct_12_3_a9df7b98 *paVar30;
  size_t k;
  ulong uVar31;
  long lVar32;
  long lVar33;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *this;
  long lVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  index_t idx2;
  index_t idx1;
  index_t idx0;
  vertex_index_t ind [3];
  real_t vx [3];
  real_t vy [3];
  face_t remainingFace;
  uchar local_12d;
  int local_12c;
  PrimGroup *local_128;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *local_120;
  pointer local_118;
  anon_struct_12_3_a9df7b98 local_10c;
  anon_struct_12_3_a9df7b98 local_100;
  anon_struct_12_3_a9df7b98 local_f4;
  anon_struct_12_3_a9df7b98 local_e8;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  pointer local_b8;
  vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *local_b0;
  float local_a4 [3];
  vector<unsigned_int,std::allocator<unsigned_int>> *local_98;
  vector<int,std::allocator<int>> *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  ulong local_80;
  uint local_74;
  undefined4 local_70;
  float local_6c [3];
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> *local_60;
  undefined8 local_58;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> local_50;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *local_38;
  
  uVar20 = CONCAT71(in_register_00000089,triangulate) & 0xffffffff;
  if (((prim_group->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (prim_group->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((prim_group->lineGroup).
      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (prim_group->lineGroup).
      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    p_Var12 = (prim_group->pointsGroup).
              super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_70 = (undefined4)
               CONCAT71((int7)((ulong)p_Var12 >> 8),
                        p_Var12 ==
                        (prim_group->pointsGroup).
                        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    local_70 = 0;
  }
  if ((char)local_70 == '\0') {
    local_12c = material_id;
    local_128 = prim_group;
    std::__cxx11::string::_M_assign((string *)shape);
    if ((local_128->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_128->faceGroup).super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pfVar16 = (local_128->faceGroup).
                super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_38 = tags;
      if ((local_128->faceGroup).
          super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar16) {
        this = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->mesh;
        local_88 = &(shape->mesh).num_face_vertices;
        local_90 = (vector<int,std::allocator<int>> *)&(shape->mesh).material_ids;
        local_98 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(shape->mesh).smoothing_group_ids;
        uVar28 = 0;
        local_74 = (uint)CONCAT71(in_register_00000089,triangulate);
        pPVar22 = local_128;
        local_b0 = this;
        do {
          pvVar19 = pfVar16[uVar28].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar23 = (long)pfVar16[uVar28].vertex_indices.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19 >> 2;
          uVar24 = lVar23 * -0x5555555555555555;
          if (2 < uVar24) {
            pfVar3 = pfVar16 + uVar28;
            __x = &pfVar16[uVar28].vertex_indices;
            local_118 = pfVar3;
            local_80 = uVar28;
            local_60 = __x;
            if ((char)uVar20 == '\0') {
              lVar23 = 8;
              uVar28 = uVar24;
              do {
                pvVar19 = (__x->
                          super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_e8.vertex_index = *(int *)((long)pvVar19 + lVar23 + -8);
                local_e8.normal_index = *(int *)((long)&pvVar19->v_idx + lVar23);
                local_e8.texcoord_index = *(int *)((long)pvVar19 + lVar23 + -4);
                iVar7._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(this,iVar7,&local_e8);
                  pPVar22 = local_128;
                  __x = local_60;
                }
                else {
                  (iVar7._M_current)->texcoord_index = local_e8.texcoord_index;
                  (iVar7._M_current)->vertex_index = local_e8.vertex_index;
                  (iVar7._M_current)->normal_index = local_e8.normal_index;
                  ppaVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                lVar23 = lVar23 + 0xc;
                uVar28 = uVar28 - 1;
              } while (uVar28 != 0);
              local_e8.vertex_index = CONCAT31(local_e8.vertex_index._1_3_,(uchar)uVar24);
              iVar8._M_current =
                   (shape->mesh).num_face_vertices.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (shape->mesh).num_face_vertices.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(local_88,iVar8,(uchar *)&local_e8);
                pPVar22 = local_128;
              }
              else {
                *iVar8._M_current = (uchar)uVar24;
                ppuVar2 = &(shape->mesh).num_face_vertices.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppuVar2 = *ppuVar2 + 1;
              }
              uVar28 = local_80;
              pfVar16 = local_118;
              iVar9._M_current =
                   (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_90,iVar9,&local_12c);
                pPVar22 = local_128;
              }
              else {
                *iVar9._M_current = local_12c;
                (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar9._M_current + 1;
              }
              iVar10._M_current =
                   (shape->mesh).smoothing_group_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>(local_98,iVar10,&pfVar16->smoothing_group_id)
                ;
                pPVar22 = local_128;
              }
              else {
                *iVar10._M_current = pfVar16->smoothing_group_id;
                (shape->mesh).smoothing_group_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar10._M_current + 1;
              }
            }
            else {
              pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar28 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pfVar5 >> 2;
              lVar33 = 2;
              lVar32 = 1;
              pvVar29 = pvVar19;
              uVar20 = 1;
              do {
                lVar34 = (long)pvVar29->v_idx;
                iVar15 = 7;
                if (lVar34 * 3 + 2U < uVar28) {
                  uVar25 = lVar23 * 0x5555555555555555 + uVar20;
                  if (uVar25 != 0) {
                    uVar25 = uVar20;
                  }
                  lVar26 = (long)pvVar19[uVar25].v_idx;
                  if ((lVar26 * 3 + 2U < uVar28) &&
                     (lVar21 = (long)pvVar19[(uVar20 + 1) % uVar24].v_idx, lVar21 * 3 + 2U < uVar28)
                     ) {
                    fVar40 = pfVar5[lVar21 * 3] - pfVar5[lVar26 * 3];
                    fVar39 = pfVar5[lVar26 * 3] - pfVar5[lVar34 * 3];
                    fVar36 = pfVar5[lVar21 * 3 + 1] - pfVar5[lVar26 * 3 + 1];
                    fVar38 = pfVar5[lVar26 * 3 + 1] - pfVar5[lVar34 * 3 + 1];
                    fVar41 = pfVar5[lVar21 * 3 + 2] - pfVar5[lVar26 * 3 + 2];
                    fVar35 = pfVar5[lVar26 * 3 + 2] - pfVar5[lVar34 * 3 + 2];
                    fVar37 = ABS(fVar38 * fVar41 - fVar36 * fVar35);
                    fVar35 = ABS(fVar35 * fVar40 - fVar41 * fVar39);
                    fVar36 = ABS(fVar36 * fVar39 - fVar38 * fVar40);
                    if (((1.1920929e-07 < fVar36) ||
                        ((1.1920929e-07 < fVar37 || (iVar15 = 0, 1.1920929e-07 < fVar35)))) &&
                       ((iVar15 = 5, fVar37 <= fVar36 || (fVar37 <= fVar35)))) {
                      lVar32 = lVar33;
                      if (fVar35 < fVar36) {
                        lVar32 = 1;
                      }
                      if (fVar37 < fVar36) {
                        lVar33 = lVar32;
                      }
                      lVar32 = 0;
                    }
                  }
                }
              } while (((iVar15 == 7) || (iVar15 == 0)) &&
                      (lVar34 = lVar23 * 0x5555555555555555 + uVar20, pvVar29 = pvVar29 + 1,
                      uVar20 = uVar20 + 1, lVar34 != 0));
              pfVar6 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar20 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pfVar6 >> 2;
              local_120 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)
                          ((ulong)pfVar5 & 0xffffffff00000000);
              lVar34 = 1;
              pvVar29 = pvVar19;
              do {
                lVar26 = 0;
                if (uVar24 - lVar34 != 0) {
                  lVar26 = lVar34;
                }
                lVar21 = (long)pvVar29->v_idx * 3;
                uVar28 = lVar21 + lVar32;
                if ((uVar28 < uVar20) && (uVar25 = lVar21 + lVar33, uVar25 < uVar20)) {
                  lVar26 = (long)pvVar19[lVar26].v_idx * 3;
                  uVar17 = lVar26 + lVar32;
                  if ((uVar17 < uVar20) && (uVar31 = lVar26 + lVar33, uVar31 < uVar20)) {
                    local_120 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)
                                CONCAT44(local_120._4_4_,
                                         local_120._0_4_ +
                                         (pfVar6[uVar28] * pfVar6[uVar31] -
                                         pfVar6[uVar17] * pfVar6[uVar25]) * 0.5);
                  }
                }
                lVar26 = (lVar23 * 0x5555555555555555 - (ulong)(uVar24 == 0)) + lVar34;
                lVar34 = lVar34 + 1;
                pvVar29 = pvVar29 + 1;
              } while (lVar26 != 0);
              local_58._0_4_ = pfVar3->smoothing_group_id;
              local_58._4_4_ = pfVar3->pad_;
              local_b8 = pvVar19;
              std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::vector
                        (&local_50,__x);
              local_d8 = -1;
              iStack_d4 = -1;
              iStack_d0 = -1;
              iStack_cc = -1;
              local_e8.vertex_index = -1;
              local_e8.normal_index = -1;
              local_e8.texcoord_index = -1;
              iStack_dc = -1;
              iStack_c8 = -1;
              lVar23 = (long)local_50.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_50.
                             super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar20 = (lVar23 >> 2) * -0x5555555555555555;
              if ((3 < uVar20) &&
                 (lVar34 = (long)(pfVar3->vertex_indices).
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pfVar3->vertex_indices).
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start, lVar34 != 0)) {
                uVar28 = (lVar34 >> 2) * -0x5555555555555555;
                uVar25 = 0;
                uVar24 = ((long)local_50.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_50.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x5555555555555555;
                do {
                  uVar17 = uVar20;
                  pvVar19 = local_50.
                            super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar20 = uVar17;
                  if (uVar25 < uVar17) {
                    uVar20 = 0;
                  }
                  uVar25 = uVar25 - uVar20;
                  pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar20 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pfVar5 >> 2;
                  paVar30 = &local_e8;
                  lVar23 = 0;
                  do {
                    uVar31 = (uVar25 + lVar23) % uVar17;
                    paVar30->texcoord_index = pvVar19[uVar31].vn_idx;
                    uVar4 = pvVar19[uVar31].v_idx;
                    uVar13 = pvVar19[uVar31].vt_idx;
                    paVar30->vertex_index = uVar4;
                    paVar30->normal_index = uVar13;
                    uVar31 = (long)(int)uVar4 * 3 + lVar32;
                    if ((uVar31 < uVar20) &&
                       (uVar18 = (long)(int)uVar4 * 3 + lVar33, uVar18 < uVar20)) {
                      local_a4[lVar23] = pfVar5[uVar31];
                      fVar35 = pfVar5[uVar18];
                    }
                    else {
                      local_a4[lVar23] = 0.0;
                      fVar35 = 0.0;
                    }
                    local_6c[lVar23] = fVar35;
                    lVar23 = lVar23 + 1;
                    paVar30 = paVar30 + 1;
                  } while (lVar23 != 3);
                  uVar28 = uVar28 - 1;
                  if (uVar24 != uVar17) {
                    uVar28 = uVar17;
                  }
                  if (0.0 <= ((local_6c[2] - local_6c[1]) * (local_a4[1] - local_a4[0]) -
                             (local_a4[2] - local_a4[1]) * (local_6c[1] - local_6c[0])) *
                             local_120._0_4_) {
                    if (3 < uVar17) {
                      pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      uVar20 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pfVar5 >> 2;
                      uVar24 = 3;
                      bVar27 = false;
                      do {
                        lVar23 = (long)pvVar19[(uVar24 + uVar25) % uVar17].v_idx * 3;
                        uVar31 = lVar23 + lVar32;
                        iVar15 = 0x12;
                        if ((uVar31 < uVar20) && (uVar18 = lVar23 + lVar33, uVar18 < uVar20)) {
                          fVar35 = pfVar5[uVar18];
                          bVar14 = false;
                          lVar23 = 2;
                          lVar34 = 0;
                          do {
                            fVar36 = local_6c[lVar34];
                            if ((fVar35 < fVar36 == local_6c[lVar23] <= fVar35) &&
                               (pfVar5[uVar31] <
                                ((fVar35 - fVar36) * (local_a4[lVar23] - local_a4[lVar34])) /
                                (local_6c[lVar23] - fVar36) + local_a4[lVar34])) {
                              bVar14 = !bVar14;
                            }
                            lVar26 = lVar34 + 1;
                            lVar23 = lVar34;
                            lVar34 = lVar26;
                          } while (lVar26 != 3);
                          if (bVar14) {
                            bVar27 = true;
                          }
                          iVar15 = (uint)bVar14 << 4;
                        }
                      } while (((iVar15 == 0x12) || (iVar15 == 0)) &&
                              (uVar24 = uVar24 + 1, uVar24 != uVar17));
                      if (bVar27) goto LAB_0022400a;
                    }
                    local_f4.vertex_index = local_e8.vertex_index;
                    local_f4.normal_index = local_e8.texcoord_index;
                    local_f4.texcoord_index = local_e8.normal_index;
                    local_100.vertex_index = iStack_dc;
                    local_100.normal_index = iStack_d4;
                    local_100.texcoord_index = local_d8;
                    local_10c.vertex_index = iStack_d0;
                    local_10c.normal_index = iStack_c8;
                    local_10c.texcoord_index = iStack_cc;
                    iVar7._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar7,&local_f4);
                    }
                    else {
                      (iVar7._M_current)->texcoord_index = local_e8.normal_index;
                      (iVar7._M_current)->vertex_index = local_e8.vertex_index;
                      (iVar7._M_current)->normal_index = local_e8.texcoord_index;
                      ppaVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar1 = *ppaVar1 + 1;
                    }
                    iVar7._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar7,&local_100);
                    }
                    else {
                      (iVar7._M_current)->texcoord_index = local_100.texcoord_index;
                      (iVar7._M_current)->vertex_index = local_100.vertex_index;
                      (iVar7._M_current)->normal_index = local_100.normal_index;
                      ppaVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar1 = *ppaVar1 + 1;
                    }
                    iVar7._M_current =
                         (shape->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (shape->mesh).indices.
                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                      _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar7,&local_10c);
                    }
                    else {
                      (iVar7._M_current)->texcoord_index = local_10c.texcoord_index;
                      (iVar7._M_current)->vertex_index = local_10c.vertex_index;
                      (iVar7._M_current)->normal_index = local_10c.normal_index;
                      ppaVar1 = &(shape->mesh).indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar1 = *ppaVar1 + 1;
                    }
                    local_12d = '\x03';
                    iVar8._M_current =
                         (shape->mesh).num_face_vertices.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar8._M_current ==
                        (shape->mesh).num_face_vertices.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_realloc_insert<unsigned_char>(local_88,iVar8,&local_12d);
                    }
                    else {
                      *iVar8._M_current = '\x03';
                      ppuVar2 = &(shape->mesh).num_face_vertices.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar2 = *ppuVar2 + 1;
                    }
                    iVar9._M_current =
                         (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (iVar9._M_current ==
                        (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_90,iVar9,&local_12c);
                    }
                    else {
                      *iVar9._M_current = local_12c;
                      (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                    }
                    iVar10._M_current =
                         (shape->mesh).smoothing_group_ids.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar10._M_current ==
                        (shape->mesh).smoothing_group_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                (local_98,iVar10,&local_118->smoothing_group_id);
                    }
                    else {
                      *iVar10._M_current = local_118->smoothing_group_id;
                      (shape->mesh).smoothing_group_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                    }
                    uVar20 = (uVar25 + 1) % uVar17;
                    while (uVar24 = uVar20 + 1, uVar24 < uVar17) {
                      local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].vn_idx =
                           local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar24].vn_idx;
                      iVar15 = local_50.
                               super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar24].vt_idx;
                      local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].v_idx =
                           local_50.
                           super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar24].v_idx;
                      local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].vt_idx = iVar15;
                      uVar20 = uVar24;
                    }
                    local_50.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_50.
                         super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
                  }
                  else {
LAB_0022400a:
                    uVar25 = uVar25 + 1;
                  }
                  lVar23 = (long)local_50.
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_50.
                                 super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  uVar20 = (lVar23 >> 2) * -0x5555555555555555;
                } while ((3 < uVar20) && (uVar24 = uVar17, uVar28 != 0));
              }
              uVar28 = local_80;
              this = local_b0;
              uVar20 = (ulong)local_74;
              if (lVar23 == 0x24) {
                local_f4.vertex_index =
                     (local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->v_idx;
                local_f4.texcoord_index =
                     (local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->vt_idx;
                local_f4.normal_index =
                     (local_50.
                      super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->vn_idx;
                local_100.vertex_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].v_idx;
                local_100.texcoord_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].vt_idx;
                local_100.normal_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].vn_idx;
                local_10c.vertex_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].v_idx;
                local_10c.texcoord_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].vt_idx;
                local_10c.normal_index =
                     local_50.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].vn_idx;
                iVar7._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(local_b0,iVar7,&local_f4);
                }
                else {
                  (iVar7._M_current)->texcoord_index = local_f4.texcoord_index;
                  (iVar7._M_current)->vertex_index = local_f4.vertex_index;
                  (iVar7._M_current)->normal_index = local_f4.normal_index;
                  ppaVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                pfVar16 = local_118;
                iVar7._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(this,iVar7,&local_100);
                }
                else {
                  (iVar7._M_current)->texcoord_index = local_100.texcoord_index;
                  (iVar7._M_current)->vertex_index = local_100.vertex_index;
                  (iVar7._M_current)->normal_index = local_100.normal_index;
                  ppaVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                iVar7._M_current =
                     (shape->mesh).indices.
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (shape->mesh).indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
                  _M_realloc_insert<tinyobj::index_t_const&>(this,iVar7,&local_10c);
                }
                else {
                  (iVar7._M_current)->texcoord_index = local_10c.texcoord_index;
                  (iVar7._M_current)->vertex_index = local_10c.vertex_index;
                  (iVar7._M_current)->normal_index = local_10c.normal_index;
                  ppaVar1 = &(shape->mesh).indices.
                             super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                local_12d = '\x03';
                iVar8._M_current =
                     (shape->mesh).num_face_vertices.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (shape->mesh).num_face_vertices.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  _M_realloc_insert<unsigned_char>(local_88,iVar8,&local_12d);
                }
                else {
                  *iVar8._M_current = '\x03';
                  ppuVar2 = &(shape->mesh).num_face_vertices.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar2 = *ppuVar2 + 1;
                }
                iVar9._M_current =
                     (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_90,iVar9,&local_12c);
                }
                else {
                  *iVar9._M_current = local_12c;
                  (shape->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                }
                iVar10._M_current =
                     (shape->mesh).smoothing_group_ids.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (shape->mesh).smoothing_group_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            (local_98,iVar10,&pfVar16->smoothing_group_id);
                }
                else {
                  *iVar10._M_current = pfVar16->smoothing_group_id;
                  (shape->mesh).smoothing_group_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                }
              }
              pPVar22 = local_128;
              if (local_50.
                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_50.
                                super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
                pPVar22 = local_128;
              }
            }
          }
          uVar28 = uVar28 + 1;
          pfVar16 = (pPVar22->faceGroup).
                    super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar28 < (ulong)((long)(pPVar22->faceGroup).
                                        super__Vector_base<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar16
                                 >> 5));
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (&(shape->mesh).tags,local_38);
    }
    pPVar22 = local_128;
    if (((local_128->lineGroup).
         super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (local_128->lineGroup).
         super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((local_128->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_128->lineGroup).
        super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      local_120 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->lines;
      local_b8 = (pointer)&(shape->lines).num_line_vertices;
      uVar20 = 0;
      do {
        p_Var11 = (pPVar22->lineGroup).
                  super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar19 = *(pointer *)
                   &p_Var11[uVar20].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl;
        if (*(pointer *)
             ((long)&p_Var11[uVar20].vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl + 8) == pvVar19) {
          uVar28 = 0;
        }
        else {
          lVar23 = 8;
          uVar24 = 0;
          do {
            local_e8.vertex_index = *(int *)((long)pvVar19 + lVar23 + -8);
            local_e8.normal_index = *(int *)((long)&pvVar19->v_idx + lVar23);
            local_e8.texcoord_index = *(int *)((long)pvVar19 + lVar23 + -4);
            iVar7._M_current =
                 (shape->lines).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (shape->lines).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>(local_120,iVar7,&local_e8);
              pPVar22 = local_128;
            }
            else {
              (iVar7._M_current)->texcoord_index = local_e8.texcoord_index;
              (iVar7._M_current)->vertex_index = local_e8.vertex_index;
              (iVar7._M_current)->normal_index = local_e8.normal_index;
              ppaVar1 = &(shape->lines).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar24 = uVar24 + 1;
            p_Var11 = (pPVar22->lineGroup).
                      super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar19 = *(pointer *)
                       &p_Var11[uVar20].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            uVar28 = ((long)*(pointer *)
                             ((long)&p_Var11[uVar20].vertex_indices.
                                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                     ._M_impl + 8) - (long)pvVar19 >> 2) * -0x5555555555555555;
            lVar23 = lVar23 + 0xc;
          } while (uVar24 < uVar28);
        }
        local_e8.vertex_index = (int)uVar28;
        iVar9._M_current =
             (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_b8,iVar9,&local_e8.vertex_index);
          pPVar22 = local_128;
        }
        else {
          *iVar9._M_current = local_e8.vertex_index;
          (shape->lines).num_line_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < (ulong)(((long)(pPVar22->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar22->lineGroup).
                                       super__Vector_base<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    if (((pPVar22->pointsGroup).
         super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (pPVar22->pointsGroup).
         super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((pPVar22->pointsGroup).
        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pPVar22->pointsGroup).
        super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      local_120 = (vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&shape->points;
      uVar20 = 0;
      do {
        p_Var12 = (pPVar22->pointsGroup).
                  super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pvVar19 = *(pointer *)
                   &p_Var12[uVar20].vertex_indices.
                    super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                    ._M_impl;
        if (*(pointer *)
             ((long)&p_Var12[uVar20].vertex_indices.
                     super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                     ._M_impl + 8) != pvVar19) {
          lVar23 = 8;
          uVar28 = 0;
          do {
            local_e8.vertex_index = *(int *)((long)pvVar19 + lVar23 + -8);
            local_e8.normal_index = *(int *)((long)&pvVar19->v_idx + lVar23);
            local_e8.texcoord_index = *(int *)((long)pvVar19 + lVar23 + -4);
            iVar7._M_current =
                 (shape->points).indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (shape->points).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
              _M_realloc_insert<tinyobj::index_t_const&>(local_120,iVar7,&local_e8);
              pPVar22 = local_128;
            }
            else {
              (iVar7._M_current)->texcoord_index = local_e8.texcoord_index;
              (iVar7._M_current)->vertex_index = local_e8.vertex_index;
              (iVar7._M_current)->normal_index = local_e8.normal_index;
              ppaVar1 = &(shape->points).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar28 = uVar28 + 1;
            p_Var12 = (pPVar22->pointsGroup).
                      super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pvVar19 = *(pointer *)
                       &p_Var12[uVar20].vertex_indices.
                        super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                        ._M_impl;
            lVar23 = lVar23 + 0xc;
          } while (uVar28 < (ulong)(((long)*(pointer *)
                                            ((long)&p_Var12[uVar20].vertex_indices.
                                                                                                        
                                                  super__Vector_base<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                                                  ._M_impl + 8) - (long)pvVar19 >> 2) *
                                   -0x5555555555555555));
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < (ulong)(((long)(pPVar22->pointsGroup).
                                       super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar22->pointsGroup).
                                       super__Vector_base<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  return (bool)((byte)local_70 ^ 1);
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}